

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::IsRFC6598(CNetAddr *this)

{
  long lVar1;
  bool bVar2;
  uchar *puVar3;
  byte *pbVar4;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  size_type pos;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar5;
  
  pos = (size_type)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsIPv4((CNetAddr *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  bVar5 = false;
  if (bVar2) {
    puVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                        (ulong)in_stack_ffffffffffffffe8,pos);
    bVar5 = false;
    if (*puVar3 == 'd') {
      pbVar4 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                          (ulong)in_stack_ffffffffffffffe8,pos);
      bVar5 = false;
      if (0x3f < *pbVar4) {
        pbVar4 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                           ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                            (ulong)in_stack_ffffffffffffffe8,pos);
        bVar5 = *pbVar4 < 0x80;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CNetAddr::IsRFC6598() const
{
    return IsIPv4() && m_addr[0] == 100 && m_addr[1] >= 64 && m_addr[1] <= 127;
}